

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString * __thiscall
SimpleStringCollection::operator[](SimpleStringCollection *this,size_t index)

{
  SimpleString *this_00;
  SimpleString local_20;
  
  if (index < this->size_) {
    this_00 = this->collection_ + index;
  }
  else {
    SimpleString::SimpleString(&local_20,"");
    this_00 = &this->empty_;
    SimpleString::operator=(this_00,&local_20);
    SimpleString::~SimpleString(&local_20);
  }
  return this_00;
}

Assistant:

SimpleString& SimpleStringCollection::operator[](size_t index)
{
    if (index >= size_) {
        empty_ = "";
        return empty_;
    }

    return collection_[index];
}